

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver_p.h
# Opt level: O0

void __thiscall QSslServerPrivate::SocketData::disconnectSignals(SocketData *this)

{
  long in_FS_OFFSET;
  Connection *__new_val;
  Connection *this_00;
  Connection local_28;
  Connection local_20;
  Connection local_18;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_18;
  QMetaObject::Connection::Connection(this_00);
  __new_val = &local_10;
  std::exchange<QMetaObject::Connection,QMetaObject::Connection>(this_00,__new_val);
  QObject::disconnect(__new_val);
  QMetaObject::Connection::~Connection(__new_val);
  QMetaObject::Connection::~Connection(this_00);
  QMetaObject::Connection::Connection(&local_28);
  std::exchange<QMetaObject::Connection,QMetaObject::Connection>(this_00,__new_val);
  QObject::disconnect(&local_20);
  QMetaObject::Connection::~Connection(&local_20);
  QMetaObject::Connection::~Connection(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void disconnectSignals()
        {
            QObject::disconnect(std::exchange(readyReadConnection, {}));
            QObject::disconnect(std::exchange(destroyedConnection, {}));
        }